

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::search::set_options(search *this,uint32_t opts)

{
  ostream *poVar1;
  undefined8 uVar2;
  uint in_ESI;
  long *in_RDI;
  stringstream __msg;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188;
  uint local_c;
  
  local_c = in_ESI;
  if (((*(byte *)(*(long *)*in_RDI + 0xd8) & 1) != 0) && (*(int *)(*in_RDI + 0x6c) != 0)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "warning: task should not set options except in initialize function!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((local_c & AUTO_CONDITION_FEATURES) != 0) {
    *(undefined1 *)(*in_RDI + 0x10) = 1;
  }
  if ((local_c & AUTO_HAMMING_LOSS) != 0) {
    *(undefined1 *)(*in_RDI + 0x11) = 1;
  }
  if ((local_c & EXAMPLES_DONT_CHANGE) != 0) {
    *(undefined1 *)(*in_RDI + 0x12) = 1;
  }
  if ((local_c & IS_LDF) != 0) {
    *(undefined1 *)(*in_RDI + 0x13) = 1;
  }
  if ((local_c & NO_CACHING) != 0) {
    *(undefined1 *)(*in_RDI + 0x7c) = 1;
  }
  if ((local_c & ACTION_COSTS) != 0) {
    *(undefined1 *)(*in_RDI + 0x14) = 1;
  }
  if (((*(byte *)(*in_RDI + 0x13) & 1) != 0) && ((*(byte *)(*in_RDI + 0x14) & 1) != 0)) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(&local_188,
                    "using LDF and actions costs is not yet implemented; turn off action costs");
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               in_stack_fffffffffffffe38);
    __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (((*(byte *)(*in_RDI + 0x14) & 1) != 0) && (*(int *)(*in_RDI + 0x298) != 4)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "warning: task is designed to use rollout costs, but this only works when --search_rollout none is specified"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void search::set_options(uint32_t opts)
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set options except in initialize function!" << endl;
  if ((opts & AUTO_CONDITION_FEATURES) != 0)
    this->priv->auto_condition_features = true;
  if ((opts & AUTO_HAMMING_LOSS) != 0)
    this->priv->auto_hamming_loss = true;
  if ((opts & EXAMPLES_DONT_CHANGE) != 0)
    this->priv->examples_dont_change = true;
  if ((opts & IS_LDF) != 0)
    this->priv->is_ldf = true;
  if ((opts & NO_CACHING) != 0)
    this->priv->no_caching = true;
  if ((opts & ACTION_COSTS) != 0)
    this->priv->use_action_costs = true;

  if (this->priv->is_ldf && this->priv->use_action_costs)
    THROW("using LDF and actions costs is not yet implemented; turn off action costs");  // TODO fix

  if (this->priv->use_action_costs && (this->priv->rollout_method != NO_ROLLOUT))
    std::cerr
        << "warning: task is designed to use rollout costs, but this only works when --search_rollout none is specified"
        << endl;
}